

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  Token *this_01;
  int iVar1;
  TransformNode *this_02;
  mapped_type *child_00;
  runtime_error *this_03;
  long *in_RDX;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  allocator local_f9;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  undefined1 local_c8 [16];
  size_t child;
  string local_a8;
  AffineSpace3fa space;
  
  this_00 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&local_a8,"child",&local_f9);
  XML::parm((string *)&space,this_00,&local_a8);
  iVar1 = atoi((char *)space.l.vx.field_0._0_8_);
  std::__cxx11::string::~string((string *)&space);
  std::__cxx11::string::~string((string *)&local_a8);
  this_01 = *(Token **)(*in_RDX + 0x98);
  child = (long)iVar1;
  if (*(long *)(*in_RDX + 0xa0) - (long)this_01 == 0x360) {
    local_c8._0_4_ = Token::Float(this_01,true);
    local_c8._4_4_ = extraout_XMM0_Db;
    local_c8._8_4_ = extraout_XMM0_Dc;
    local_c8._12_4_ = extraout_XMM0_Dd;
    local_e8._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    local_e8._4_4_ = extraout_XMM0_Db_00;
    local_e8._8_4_ = extraout_XMM0_Dc_00;
    local_e8._12_4_ = extraout_XMM0_Dd_00;
    fVar2 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x90),true);
    local_c8._4_4_ = local_e8._0_4_;
    local_c8._8_4_ = fVar2;
    local_c8._12_4_ = 0;
    local_e8._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0xd8),true);
    local_e8._4_4_ = extraout_XMM0_Db_01;
    local_e8._8_4_ = extraout_XMM0_Dc_01;
    local_e8._12_4_ = extraout_XMM0_Dd_01;
    local_f8._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x120),true);
    local_f8._4_4_ = extraout_XMM0_Db_02;
    local_f8._8_4_ = extraout_XMM0_Dc_02;
    local_f8._12_4_ = extraout_XMM0_Dd_02;
    fVar2 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x168),true);
    local_e8._4_4_ = local_f8._0_4_;
    local_e8._8_4_ = fVar2;
    local_e8._12_4_ = 0;
    local_f8._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x1b0),true);
    local_f8._4_4_ = extraout_XMM0_Db_03;
    local_f8._8_4_ = extraout_XMM0_Dc_03;
    local_f8._12_4_ = extraout_XMM0_Dd_03;
    local_d8 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x1f8),true);
    fVar2 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x240),true);
    local_f8._4_4_ = local_d8;
    local_f8._8_4_ = fVar2;
    local_f8._12_4_ = 0;
    local_d8 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x288),true);
    fVar2 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x2d0),true);
    fVar3 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x318),true);
    space.l.vx.field_0._0_8_ = local_c8._0_8_;
    space.l.vx.field_0._8_8_ = local_c8._8_8_;
    space.l.vy.field_0._0_8_ = local_e8._0_8_;
    space.l.vy.field_0._8_8_ = local_e8._8_8_;
    space.l.vz.field_0._0_8_ = local_f8._0_8_;
    space.l.vz.field_0._8_8_ = local_f8._8_8_;
    space.p.field_0.m128[1] = fVar2;
    space.p.field_0.m128[0] = local_d8;
    space.p.field_0.m128[2] = fVar3;
    space.p.field_0.m128[3] = 0.0;
    this_02 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
    child_00 = std::
               map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::at((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     *)(xml + 0xc),&child);
    SceneGraph::TransformNode::TransformNode(this_02,&space,child_00);
    (this->path).filename._M_dataplus._M_p = (pointer)this_02;
    (**(code **)((long)(this_02->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_02);
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_a8,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&space,
                 &local_a8,": wrong AffineSpace body");
  std::runtime_error::runtime_error(this_03,(string *)&space);
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFTransformNode(const Ref<XML>& xml) 
  {
    const size_t child = atoi(xml->parm("child").c_str()); 
    if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
    const AffineSpace3fa space(LinearSpace3fa(Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float()),
                                              Vec3fa(xml->body[3].Float(),xml->body[4].Float(),xml->body[5].Float()),
                                              Vec3fa(xml->body[6].Float(),xml->body[7].Float(),xml->body[8].Float())),
                               Vec3fa(xml->body[9].Float(),xml->body[10].Float(),xml->body[11].Float()));
    return new SceneGraph::TransformNode(space,id2node.at(child));
  }